

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_ptr mpz_realloc(__mpz_struct *r,mp_size_t size)

{
  mp_ptr pmVar1;
  int local_24;
  mp_size_t local_20;
  mp_size_t size_local;
  __mpz_struct *r_local;
  
  local_20 = size;
  if (size < 2) {
    local_20 = 1;
  }
  if (r->_mp_alloc == 0) {
    pmVar1 = gmp_xalloc_limbs(local_20);
    r->_mp_d = pmVar1;
  }
  else {
    pmVar1 = gmp_xrealloc_limbs(r->_mp_d,local_20);
    r->_mp_d = pmVar1;
  }
  r->_mp_alloc = (int)local_20;
  if (r->_mp_size < 0) {
    local_24 = -r->_mp_size;
  }
  else {
    local_24 = r->_mp_size;
  }
  if (local_20 < local_24) {
    r->_mp_size = 0;
  }
  return r->_mp_d;
}

Assistant:

static mp_ptr
mpz_realloc (mpz_t r, mp_size_t size)
{
  size = GMP_MAX (size, 1);

  if (r->_mp_alloc)
    r->_mp_d = gmp_xrealloc_limbs (r->_mp_d, size);
  else
    r->_mp_d = gmp_xalloc_limbs (size);
  r->_mp_alloc = size;

  if (GMP_ABS (r->_mp_size) > size)
    r->_mp_size = 0;

  return r->_mp_d;
}